

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::GetType(VirtualMachine *this)

{
  element_type *peVar1;
  anon_union_8_6_52c89740_for_Variable_1 aVar2;
  char *pcVar3;
  char *pcVar4;
  Variable VVar5;
  string local_40;
  
  VVar5 = popOpStack(this);
  aVar2.stringValue = Heap::NewString_abi_cxx11_(&this->heap);
  switch(VVar5.type) {
  case Undefined:
    pcVar4 = (char *)((aVar2.objectValue)->properties)._M_h._M_bucket_count;
    pcVar3 = "undefined";
    break;
  case Integer:
    pcVar4 = (char *)((aVar2.objectValue)->properties)._M_h._M_bucket_count;
    pcVar3 = "integer";
    break;
  case Boolean:
    pcVar4 = (char *)((aVar2.objectValue)->properties)._M_h._M_bucket_count;
    pcVar3 = "boolean";
    break;
  case Float:
    pcVar4 = (char *)((aVar2.objectValue)->properties)._M_h._M_bucket_count;
    pcVar3 = "float";
    break;
  case String:
    pcVar4 = (char *)((aVar2.objectValue)->properties)._M_h._M_bucket_count;
    pcVar3 = "string";
    break;
  case Object:
    pcVar4 = (char *)((aVar2.objectValue)->properties)._M_h._M_bucket_count;
    pcVar3 = "object";
    break;
  case Function:
    pcVar4 = (char *)((aVar2.objectValue)->properties)._M_h._M_bucket_count;
    pcVar3 = "function";
    break;
  default:
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unknown varible type at variableEquals","");
    panic(this,&local_40);
  }
  std::__cxx11::string::_M_replace(aVar2.integerValue,0,pcVar4,(ulong)pcVar3);
  VVar5.field_1.integerValue = aVar2.integerValue;
  VVar5._0_8_ = 4;
  pushOpStack(this,VVar5);
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::GetType() {
  Variable top = this->popOpStack();

  auto str = this->heap.NewString();

  switch (top.type) {
    case VariableType::Integer: {
      str->assign("integer");
      break;
    }
    case VariableType::Float: {
      str->assign("float");
      break;
    }
    case VariableType::Function: {
      str->assign("function");
      break;
    }
    case VariableType::Object: {
      str->assign("object");
      break;
    }
    case VariableType::String: {
      str->assign("string");
      break;
    }
    case VariableType::Undefined: {
      str->assign("undefined");
      break;
    }
    case VariableType::Boolean: {
      str->assign("boolean");
      break;
    }
    default: {
      this->panic("Unknown varible type at variableEquals");
    }
  }

  this->pushString(str);
  this->advance();
}